

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall Lowerer::LowerDivI4Common(Lowerer *this,Instr *instr)

{
  OpCode OVar1;
  undefined2 uVar2;
  Opnd *dst;
  Opnd *src1;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  LabelInstr *target;
  LabelInstr *target_00;
  LabelInstr *target_01;
  int64 iVar8;
  Lowerer *pLVar9;
  LabelInstr *target_02;
  Opnd *pOVar10;
  Opnd *this_00;
  Lowerer *pLVar11;
  
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69c9,"(instr)","instr");
    if (!bVar4) goto LAB_005eaab3;
    *puVar6 = 0;
  }
  uVar2 = instr->m_opcode;
  if (3 < (ushort)(uVar2 - 0x1c3)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69cb,
                       "((instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) || (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4))"
                       ,
                       "(instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) || (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4)"
                      );
    if (!bVar4) goto LAB_005eaab3;
    *puVar6 = 0;
  }
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar7);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x69cc,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar4) goto LAB_005eaab3;
    *puVar6 = 0;
  }
  OVar1 = instr->m_opcode;
  target = InsertLabel(true,instr);
  target_00 = InsertLabel(false,instr);
  target_01 = InsertLabel(false,instr->m_next);
  dst = instr->m_dst;
  this_00 = instr->m_src1;
  src1 = instr->m_src2;
  pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsWasmFunction(pJVar7);
  if (bVar4) {
    if (1 < (ushort)(OVar1 - Rem_I4)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x69ea,"(!isWasm || isRem)","!isWasm || isRem");
      if (!bVar4) goto LAB_005eaab3;
      *puVar6 = 0;
    }
  }
  else {
    InsertTest(src1,src1,&target->super_Instr);
    InsertBranch(BrEq_A,false,target,&target->super_Instr);
    pOVar10 = IR::IntConstOpnd::NewFromType(0,dst->m_type,this->m_func);
    InsertMove(dst,pOVar10,&target_00->super_Instr,true);
    InsertBranch(Br,false,target_01,&target_00->super_Instr);
  }
  bVar4 = IRType_IsSignedInt(instr->m_src1->m_type);
  if (!bVar4) goto LAB_005eaa33;
  bVar4 = IRType_IsInt64(this_00->m_type);
  pLVar11 = (Lowerer *)0xffffffff80000000;
  if (bVar4) {
    pLVar11 = (Lowerer *)0x8000000000000000;
  }
  OVar5 = IR::Opnd::GetKind(src1);
  if (OVar5 == OpndKindIntConst) {
LAB_005ea7dd:
    iVar8 = IR::Opnd::GetImmediateValue(src1,this->m_func);
    bVar4 = iVar8 == -1;
  }
  else {
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 == OpndKindInt64Const) goto LAB_005ea7dd;
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 == OpndKindAddr) goto LAB_005ea7dd;
    OVar5 = IR::Opnd::GetKind(src1);
    bVar4 = true;
    if (OVar5 == OpndKindHelperCall) goto LAB_005ea7dd;
  }
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 == OpndKindIntConst) {
LAB_005ea828:
    if (!bVar4) goto LAB_005eaa33;
    pLVar9 = (Lowerer *)IR::Opnd::GetImmediateValue(this_00,this->m_func);
    if (pLVar9 != pLVar11) goto LAB_005eaa33;
    target_02 = InsertLabel(true,&target_00->super_Instr);
    InsertBranch(Br,false,target_02,&target->super_Instr);
  }
  else {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 == OpndKindInt64Const) goto LAB_005ea828;
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 == OpndKindAddr) goto LAB_005ea828;
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 == OpndKindHelperCall) goto LAB_005ea828;
    if (!bVar4) goto LAB_005eaa33;
    target_02 = InsertLabel(true,&target_00->super_Instr);
    pOVar10 = IR::IntConstOpnd::NewFromType((int64)pLVar11,this_00->m_type,this->m_func);
    InsertCompareBranch(pLVar11,this_00,pOVar10,BrEq_A,false,target_02,&target->super_Instr,false);
  }
  if (target_02 == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6a0c,"(minIntLabel)","minIntLabel");
    if (!bVar4) goto LAB_005eaab3;
    *puVar6 = 0;
  }
  OVar5 = IR::Opnd::GetKind(src1);
  if (OVar5 == OpndKindIntConst) {
LAB_005ea90d:
    iVar8 = IR::Opnd::GetImmediateValue(src1,this->m_func);
    if (iVar8 != -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x6a0d,
                         "(!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1)",
                         "!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1");
      if (!bVar4) {
LAB_005eaab3:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  else {
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 == OpndKindInt64Const) goto LAB_005ea90d;
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 == OpndKindAddr) goto LAB_005ea90d;
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 == OpndKindHelperCall) goto LAB_005ea90d;
  }
  OVar5 = IR::Opnd::GetKind(src1);
  if (OVar5 != OpndKindIntConst) {
    OVar5 = IR::Opnd::GetKind(src1);
    if (OVar5 != OpndKindInt64Const) {
      OVar5 = IR::Opnd::GetKind(src1);
      if (OVar5 != OpndKindAddr) {
        OVar5 = IR::Opnd::GetKind(src1);
        if (OVar5 != OpndKindHelperCall) {
          pLVar11 = (Lowerer *)&DAT_ffffffffffffffff;
          pOVar10 = IR::IntConstOpnd::NewFromType(-1,src1->m_type,this->m_func);
          InsertCompareBranch(pLVar11,src1,pOVar10,BrNeq_A,false,target_00,&target_00->super_Instr,
                              false);
        }
      }
    }
  }
  if ((ushort)(OVar1 - Rem_I4) < 2) {
    this_00 = IR::IntConstOpnd::NewFromType(0,dst->m_type,this->m_func);
  }
  InsertMove(dst,this_00,&target_00->super_Instr,true);
  InsertBranch(Br,false,target_01,&target_00->super_Instr);
LAB_005eaa33:
  InsertBranch(Br,false,target_00,&target->super_Instr);
  LowererMD::EmitInt4Instr(instr);
  return;
}

Assistant:

void
Lowerer::LowerDivI4Common(IR::Instr * instr)
{
    Assert(instr);
    Assert((instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::Div_I4) ||
        (instr->m_opcode == Js::OpCode::RemU_I4 || instr->m_opcode == Js::OpCode::DivU_I4));
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());

    const bool isRem = instr->m_opcode == Js::OpCode::Rem_I4 || instr->m_opcode == Js::OpCode::RemU_I4;
    // MIN_INT/-1 path is only needed for signed operations

    //       TEST src2, src2
    //       JEQ $div0
    //       CMP src1, MIN_INT
    //       JEQ $minInt
    //       JMP $div
    // $div0: [helper]
    //       MOV dst, 0
    //       JMP $done
    // $minInt: [helper]
    //       CMP src2, -1
    //       JNE $div
    // dst = MOV src1 / 0
    //       JMP $done
    // $div:
    // dst = IDIV src2, src1
    // $done:

    IR::LabelInstr * div0Label = InsertLabel(true, instr);
    IR::LabelInstr * divLabel = InsertLabel(false, instr);
    IR::LabelInstr * doneLabel = InsertLabel(false, instr->m_next);
    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    bool isWasm = m_func->GetJITFunctionBody()->IsWasmFunction();
    Assert(!isWasm || isRem);

    if (!isWasm)
    {
        InsertTestBranch(src2, src2, Js::OpCode::BrEq_A, div0Label, div0Label);
        InsertMove(dst, IR::IntConstOpnd::NewFromType(0, dst->GetType(), m_func), divLabel);
        InsertBranch(Js::OpCode::Br, doneLabel, divLabel);
    }

    if (instr->GetSrc1()->IsSigned())
    {
        IR::LabelInstr * minIntLabel = nullptr;
        // we need to check for INT_MIN/-1 if divisor is either -1 or variable, and dividend is either INT_MIN or variable
        int64 intMin = IRType_IsInt64(src1->GetType()) ? LONGLONG_MIN : INT_MIN;
        bool needsMinOverNeg1Check = !(src2->IsImmediateOpnd() && src2->GetImmediateValue(m_func) != -1);
        if (src1->IsImmediateOpnd())
        {
            if (needsMinOverNeg1Check && src1->GetImmediateValue(m_func) == intMin)
            {
                minIntLabel = InsertLabel(true, divLabel);
                InsertBranch(Js::OpCode::Br, minIntLabel, div0Label);
            }
            else
            {
                needsMinOverNeg1Check = false;
            }
        }
        else if(needsMinOverNeg1Check)
        {
            minIntLabel = InsertLabel(true, divLabel);
            InsertCompareBranch(src1, IR::IntConstOpnd::NewFromType(intMin, src1->GetType(), m_func), Js::OpCode::BrEq_A, minIntLabel, div0Label);
        }
        if (needsMinOverNeg1Check)
        {
            Assert(minIntLabel);
            Assert(!src2->IsImmediateOpnd() || src2->GetImmediateValue(m_func) == -1);
            if (!src2->IsImmediateOpnd())
            {
                InsertCompareBranch(src2, IR::IntConstOpnd::NewFromType(-1, src2->GetType(), m_func), Js::OpCode::BrNeq_A, divLabel, divLabel);
            }

            InsertMove(dst, !isRem ? src1 : IR::IntConstOpnd::NewFromType(0, dst->GetType(), m_func), divLabel);
            InsertBranch(Js::OpCode::Br, doneLabel, divLabel);
        }
    }
    InsertBranch(Js::OpCode::Br, divLabel, div0Label);

    m_lowererMD.EmitInt4Instr(instr);
}